

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O2

int __thiscall
Simple::Lib::
ProtoSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
::SignalLink::unlink(SignalLink *this,char *__name)

{
  SignalLink *pSVar1;
  SignalLink *pSVar2;
  int extraout_EAX;
  
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
  ::operator=(&this->function,(nullptr_t)0x0);
  pSVar1 = this->next;
  pSVar2 = this->prev;
  if (pSVar1 != (SignalLink *)0x0) {
    pSVar1->prev = pSVar2;
  }
  if (pSVar2 != (SignalLink *)0x0) {
    pSVar2->next = pSVar1;
  }
  decref(this);
  return extraout_EAX;
}

Assistant:

void
    unlink ()
    {
      function = nullptr;
      if (next)
        next->prev = prev;
      if (prev)
        prev->next = next;
      decref();
      // leave intact ->next, ->prev for stale iterators
    }